

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCom.c
# Opt level: O1

int If_CommandReadBox(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  FILE *__stream_00;
  If_LibBox_t *pLib;
  If_LibBox_t *p;
  char *pcVar4;
  char *pcVar5;
  
  Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = true;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"evh"), iVar3 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 != 0x65) goto LAB_0041781d;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (globalUtilOptind + 1 == argc) {
    pcVar4 = argv[globalUtilOptind];
    __stream_00 = fopen(pcVar4,"r");
    if (__stream_00 == (FILE *)0x0) {
      fprintf(__stream,"Cannot open input file \"%s\". ",pcVar4);
      pcVar4 = Extra_FileGetSimilarName(pcVar4,".genlib",".lib",".gen",".g",(char *)0x0);
      if (pcVar4 != (char *)0x0) {
        fprintf(__stream,"Did you mean \"%s\"?",pcVar4);
      }
      fputc(10,__stream);
      return 1;
    }
    fclose(__stream_00);
    if (bVar1) {
      pLib = If_LibBoxRead2(pcVar4);
    }
    else {
      pLib = If_LibBoxRead(pcVar4);
    }
    if (pLib != (If_LibBox_t *)0x0) {
      p = (If_LibBox_t *)Abc_FrameReadLibBox();
      If_LibBoxFree(p);
      Abc_FrameSetLibBox(pLib);
      return 0;
    }
    fwrite("Reading box library has failed.\n",0x20,1,__stream);
  }
LAB_0041781d:
  fwrite("\nusage: read_box [-evh]\n",0x18,1,__stream);
  fwrite("\t          read the box library from the file\n",0x2e,1,__stream);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  fprintf(__stream,"\t-e      : toggles reading extended format [default = %s]\n",pcVar4);
  if (!bVar2) {
    pcVar5 = "no";
  }
  fprintf(__stream,"\t-v      : toggles enabling of verbose output [default = %s]\n",pcVar5);
  fwrite("\t-h      : print the command usage\n",0x23,1,__stream);
  return 1;
}

Assistant:

int If_CommandReadBox( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    If_LibBox_t * pLib;
    Abc_Ntk_t * pNet;
    char * FileName;
    int fExtended;
    int fVerbose;
    int c;

    pNet = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    fExtended = 0;
    fVerbose = 1;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "evh")) != EOF ) 
    {
        switch (c) 
        {
            case 'e':
                fExtended ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
        goto usage;

    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".genlib", ".lib", ".gen", ".g", NULL )) )
            fprintf( pErr, "Did you mean \"%s\"?", FileName );
        fprintf( pErr, "\n" );
        return 1;
    }
    fclose( pFile );

    // set the new network
    pLib = fExtended ? If_LibBoxRead2( FileName ) : If_LibBoxRead( FileName );
    if ( pLib == NULL )
    {
        fprintf( pErr, "Reading box library has failed.\n" );
        goto usage;
    }
    // replace the current library
    If_LibBoxFree( (If_LibBox_t *)Abc_FrameReadLibBox() );
    Abc_FrameSetLibBox( pLib );
    return 0;

usage:
    fprintf( pErr, "\nusage: read_box [-evh]\n");
    fprintf( pErr, "\t          read the box library from the file\n" );  
    fprintf( pErr, "\t-e      : toggles reading extended format [default = %s]\n", (fExtended? "yes" : "no") );
    fprintf( pErr, "\t-v      : toggles enabling of verbose output [default = %s]\n", (fVerbose? "yes" : "no") );
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       /* error exit */
}